

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O1

void deqp::gles3::Functional::DepthStencilCaseUtil::generateBaseClearAndDepthCommands
               (TestRenderTarget *target,
               vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
               *clearCommands,
               vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
               *renderCommands)

{
  deUint32 dVar1;
  deUint32 dVar2;
  int ndx_1;
  NotSupportedError *this;
  int ndx;
  deUint32 dVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  FaceType FVar7;
  FaceType FVar8;
  int iVar9;
  int x1;
  int iVar10;
  long lVar11;
  float depthValues [3];
  int stencilValues [16];
  undefined1 local_f8 [32];
  float fStack_d8;
  deUint32 dStack_d4;
  undefined8 uStack_d0;
  undefined1 uStack_c8;
  undefined7 local_c7;
  undefined1 uStack_c0;
  undefined8 uStack_bf;
  deUint32 local_b4;
  float fStack_b0;
  bool local_ac;
  FaceType local_a8;
  int iStack_a4;
  undefined8 uStack_a0;
  float local_98 [4];
  BVec4 local_88;
  float afStack_84 [3];
  deUint32 adStack_78 [18];
  
  local_f8._8_4_ = target->width;
  dVar3 = local_f8._8_4_ + 3;
  if (-1 < (int)local_f8._8_4_) {
    dVar3 = local_f8._8_4_;
  }
  local_f8._12_4_ = target->height;
  iVar10 = local_f8._12_4_ + 3;
  if (-1 < (int)local_f8._12_4_) {
    iVar10 = local_f8._12_4_;
  }
  if ((0xb < (int)local_f8._8_4_) && (3 < (int)local_f8._12_4_)) {
    iVar10 = iVar10 >> 2;
    dVar2 = (int)local_f8._8_4_ / 0xc;
    local_f8._0_8_ = (pointer)0x0;
    local_f8._16_4_ = 0x4000;
    local_f8._20_4_ = 0.0;
    local_f8._24_4_ = 0.0;
    local_f8._28_4_ = 0.0;
    fStack_d8 = 1.0;
    dStack_d4 = 0;
    std::
    vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
    ::emplace_back<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>
              (clearCommands,(ClearCommand *)local_f8);
    iVar9 = target->stencilBits;
    lVar4 = 0;
    do {
      adStack_78[lVar4] = (deUint32)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    uVar5 = 0xf00000000;
    lVar4 = 0;
    do {
      *(int *)((long)adStack_78 + (uVar5 >> 0x1e)) = ~(-1 << ((byte)iVar9 & 0x1f)) + (int)lVar4;
      uVar5 = uVar5 - 0x100000000;
      lVar4 = lVar4 + -1;
    } while (lVar4 != -8);
    lVar4 = 0;
    do {
      afStack_84[lVar4] = (float)(int)lVar4 + -1.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar4 = 0;
    do {
      iVar9 = (int)lVar4 * iVar10;
      FVar8 = FACETYPE_FRONT;
      lVar6 = 0;
      do {
        dVar1 = adStack_78[lVar4 * 4 + lVar6];
        lVar11 = 0;
        FVar7 = FVar8;
        do {
          local_f8._8_8_ = CONCAT44(iVar10,dVar2);
          local_f8._16_4_ = 0x400;
          local_f8._20_4_ = 0.0;
          local_f8._24_4_ = 0.0;
          local_f8._28_4_ = 0.0;
          fStack_d8 = 0.0;
          dStack_d4 = dVar1;
          local_f8._0_4_ = FVar7;
          local_f8._4_4_ = iVar9;
          std::
          vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
          ::emplace_back<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>
                    (clearCommands,(ClearCommand *)local_f8);
          local_f8._0_8_ = (ulong)(uint3)local_f8._5_3_ << 0x28;
          uStack_c0 = 0;
          uStack_d0._0_4_ = 0;
          uStack_d0._4_4_ = 0;
          uStack_c8 = 0;
          local_c7 = 0;
          local_f8._24_4_ = 0.0;
          local_f8._28_4_ = 0.0;
          fStack_d8 = 0.0;
          dStack_d4 = 0;
          local_f8._8_8_ = 0;
          local_f8._16_4_ = 0;
          local_f8._20_4_ = 0.0;
          local_98[0] = 0.0;
          local_98[1] = 0.0;
          local_98[2] = 0.0;
          local_98[3] = 0.0;
          uStack_bf = 0x100000000000000;
          fStack_b0 = afStack_84[lVar11];
          local_b4 = 0x207;
          local_ac = true;
          local_88.m_data[0] = false;
          local_88.m_data[1] = false;
          local_88.m_data[2] = false;
          local_88.m_data[3] = false;
          iStack_a4 = iVar9;
          local_a8 = FVar7;
          uStack_a0._4_4_ = iVar10;
          uStack_a0._0_4_ = dVar2;
          std::
          vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
          ::push_back(renderCommands,(value_type *)local_f8);
          lVar11 = lVar11 + 1;
          FVar7 = FVar7 + dVar2;
        } while (lVar11 != 3);
        lVar6 = lVar6 + 1;
        FVar8 = FVar8 + ((int)dVar3 >> 2);
      } while (lVar6 != 4);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Too small render target","");
  tcu::NotSupportedError::NotSupportedError(this,(string *)local_f8);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void generateBaseClearAndDepthCommands (const TestRenderTarget& target, vector<ClearCommand>& clearCommands, vector<RenderCommand>& renderCommands)
{
	DE_ASSERT(clearCommands.empty());
	DE_ASSERT(renderCommands.empty());

	const int		numL0CellsX		= 4;
	const int		numL0CellsY		= 4;
	const int		numL1CellsX		= 3;
	const int		numL1CellsY		= 1;
	int				cellL0Width		= target.width/numL0CellsX;
	int				cellL0Height	= target.height/numL0CellsY;
	int				cellL1Width		= cellL0Width/numL1CellsX;
	int				cellL1Height	= cellL0Height/numL1CellsY;

	int				stencilValues[numL0CellsX*numL0CellsY];
	float			depthValues[numL1CellsX*numL1CellsY];

	if (cellL0Width <= 0 || cellL1Width <= 0 || cellL0Height <= 0 || cellL1Height <= 0)
		throw tcu::NotSupportedError("Too small render target");

	// Fullscreen clear to black.
	clearCommands.push_back(ClearCommand(rr::WindowRectangle(0, 0, target.width, target.height), GL_COLOR_BUFFER_BIT, Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0));

	// Compute stencil values: numL0CellsX*numL0CellsY combinations of lowest and highest bits.
	getStencilTestValues(target.stencilBits, numL0CellsX*numL0CellsY, &stencilValues[0]);

	// Compute depth values
	{
		int		numValues		= DE_LENGTH_OF_ARRAY(depthValues);
		float	depthStep		= 2.0f/(float)(numValues-1);

		for (int ndx = 0; ndx < numValues; ndx++)
			depthValues[ndx] = -1.0f + depthStep*(float)ndx;
	}

	for (int y0 = 0; y0 < numL0CellsY; y0++)
	{
		for (int x0 = 0; x0 < numL0CellsX; x0++)
		{
			int stencilValue = stencilValues[y0*numL0CellsX + x0];

			for (int y1 = 0; y1 < numL1CellsY; y1++)
			{
				for (int x1 = 0; x1 < numL1CellsX; x1++)
				{
					int					x			= x0*cellL0Width + x1*cellL1Width;
					int					y			= y0*cellL0Height + y1*cellL1Height;
					rr::WindowRectangle	cellL1Rect	(x, y, cellL1Width, cellL1Height);

					clearCommands.push_back(ClearCommand(cellL1Rect, GL_STENCIL_BUFFER_BIT, Vec4(0), stencilValue));

					RenderCommand renderCmd;
					renderCmd.params.visibleFace		= rr::FACETYPE_FRONT;
					renderCmd.params.depth				= depthValues[y1*numL1CellsX + x1];;
					renderCmd.params.depthTestEnabled	= true;
					renderCmd.params.depthFunc			= GL_ALWAYS;
					renderCmd.params.depthWriteMask		= true;
					renderCmd.colorMask					= tcu::BVec4(false);
					renderCmd.rect						= cellL1Rect;

					renderCommands.push_back(renderCmd);
				}
			}
		}
	}
}